

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O0

bool __thiscall
helics::MessageTimer::addTimeToTimer(MessageTimer *this,int32_t timerIndex,nanoseconds time)

{
  action_t aVar1;
  size_type sVar2;
  time_point this_00;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar3;
  reference pvVar4;
  reference this_01;
  int in_ESI;
  long in_RDI;
  byte bVar5;
  bool ret;
  type timerCallback;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  newTime;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  token;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int iVar6;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *in_stack_ffffffffffffffa0;
  bool local_1;
  
  CLI::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (-1 < in_ESI) {
    iVar6 = in_ESI;
    sVar2 = std::
            vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
            ::size((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                    *)(in_RDI + 0x88));
    if (iVar6 < (int)sVar2) {
      std::
      vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
      ::operator[]((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                    *)(in_RDI + 0x88),(long)in_ESI);
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x6a50ce);
      this_00 = ::asio::
                basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                              *)CONCAT44(iVar6,in_stack_ffffffffffffff88));
      tVar3 = std::chrono::operator+
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)CONCAT44(iVar6,in_stack_ffffffffffffff88),
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)this_00.__d.__r);
      token = tVar3;
      std::
      vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
      ::operator[]((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                    *)(in_RDI + 0x88),(long)in_ESI);
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x6a5123);
      ::asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_at(in_stack_ffffffffffffffa0,
                   (time_point *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      std::enable_shared_from_this<helics::MessageTimer>::shared_from_this
                ((enable_shared_from_this<helics::MessageTimer> *)token.__d.__r);
      pvVar4 = std::
               vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
               ::operator[]((vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                             *)(in_RDI + 0x50),(long)in_ESI);
      (pvVar4->__d).__r = (rep)tVar3.__d.__r;
      this_01 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                operator[]((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                           (in_RDI + 0x38),(long)in_ESI);
      aVar1 = ActionMessage::action(this_01);
      bVar5 = aVar1 != cmd_ignore;
      std::
      vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
      ::operator[]((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                    *)(in_RDI + 0x88),(long)in_ESI);
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x6a51a6);
      ::asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::
      async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30)_&>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  *)this_00.__d.__r,(type *)token.__d.__r);
      local_1 = (bool)(bVar5 & 1);
      addTimeToTimer(int,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::$_0::~__0
                ((type *)0x6a51d4);
      goto LAB_006a5210;
    }
  }
  local_1 = false;
LAB_006a5210:
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x6a521a);
  return local_1;
}

Assistant:

bool MessageTimer::addTimeToTimer(int32_t timerIndex, std::chrono::nanoseconds time)
{
    std::lock_guard<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        auto newTime = timers[timerIndex]->expires_at() + time;
        timers[timerIndex]->expires_at(newTime);
        auto timerCallback = [ptr = shared_from_this(), timerIndex](const std::error_code& ec) {
            processTimerCallback(ptr, timerIndex, ec);
        };
        expirationTimes[timerIndex] = newTime;
        auto ret = (buffers[timerIndex].action() != CMD_IGNORE);
        timers[timerIndex]->async_wait(timerCallback);
        return ret;
    }
    return false;
}